

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QIBusAttribute>::reallocateAndGrow
          (QArrayDataPointer<QIBusAttribute> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QIBusAttribute> *old)

{
  long lVar1;
  bool bVar2;
  QGenericArrayOps<QIBusAttribute> *this_00;
  QIBusAttribute *b;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<QIBusAttribute> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QIBusAttribute> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  QIBusAttribute *in_stack_ffffffffffffff80;
  QIBusAttribute *in_stack_ffffffffffffff88;
  QGenericArrayOps<QIBusAttribute> *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<QIBusAttribute> *)in_stack_ffffffffffffff80), bVar2))
     || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QIBusAttribute> *)0xaaaaaaaaaaaaaaaa,-0x5555555555555556,
                 0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QIBusAttribute> *)in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QIBusAttribute> *)
                  operator->((QArrayDataPointer<QIBusAttribute> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QIBusAttribute> *)0x1343ec);
        begin((QArrayDataPointer<QIBusAttribute> *)0x1343fb);
        QtPrivate::QGenericArrayOps<QIBusAttribute>::copyAppend
                  (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (QIBusAttribute *)
             operator->((QArrayDataPointer<QIBusAttribute> *)&stack0xffffffffffffffe0);
        b = begin((QArrayDataPointer<QIBusAttribute> *)0x134431);
        begin((QArrayDataPointer<QIBusAttribute> *)0x134440);
        QtPrivate::QGenericArrayOps<QIBusAttribute>::moveAppend
                  (in_stack_ffffffffffffff90,b,in_stack_ffffffffffffff80);
      }
    }
    swap((QArrayDataPointer<QIBusAttribute> *)in_stack_ffffffffffffff80,
         (QArrayDataPointer<QIBusAttribute> *)
         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QIBusAttribute> *)in_stack_ffffffffffffff80,
           (QArrayDataPointer<QIBusAttribute> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer((QArrayDataPointer<QIBusAttribute> *)in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity((QArrayDataPointer<QIBusAttribute> *)in_stack_ffffffffffffff80);
    freeSpaceAtEnd((QArrayDataPointer<QIBusAttribute> *)in_stack_ffffffffffffff88);
    QtPrivate::QMovableArrayOps<QIBusAttribute>::reallocate
              ((QMovableArrayOps<QIBusAttribute> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }